

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl-int-reader.hpp
# Opt level: O0

int64_t yactfr::internal::anon_unknown_0::readFlSIntBe37At5(uint8_t *buf)

{
  ulong uVar1;
  ulong local_18;
  uint64_t res;
  uint8_t *buf_local;
  
  uVar1 = ((ulong)CONCAT41(CONCAT31(CONCAT21(CONCAT11(*buf,buf[1]),buf[2]),buf[3]),buf[4]) &
          0x7ffffffff) << 2;
  local_18 = (long)((int)(uint)buf[5] >> 6) | uVar1;
  if (uVar1 >> 0x24 != 0) {
    local_18 = local_18 | 0xffffffe000000000;
  }
  return local_18;
}

Assistant:

std::int64_t readFlSIntBe37At5(const std::uint8_t * const buf) {
    std::uint64_t res = 0;

    res |= buf[0];
    res <<= 8;
    res |= buf[1];
    res <<= 8;
    res |= buf[2];
    res <<= 8;
    res |= buf[3];
    res <<= 8;
    res |= buf[4];
    res <<= 2;
    res |= (buf[5] >> 6);
    res &= UINT64_C(0x1fffffffff);

    if (res >> 36) {
        res |= UINT64_C(0xffffffe000000000);
    }

    return static_cast<std::int64_t>(res);
}